

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

void If_CutFoundFanins_rec(If_Obj_t *pObj,Vec_Int_t *vLeaves)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  for (; (pObj->nRefs == 0 &&
         (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x2));
      pObj = pObj->pFanin1) {
    If_CutFoundFanins_rec(pObj->pFanin0,vLeaves);
  }
  iVar1 = pObj->Id;
  uVar2 = vLeaves->nSize;
  if (0 < (long)(int)uVar2) {
    lVar5 = 0;
    do {
      if (vLeaves->pArray[lVar5] == iVar1) {
        return;
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar2 != lVar5);
  }
  uVar3 = vLeaves->nCap;
  if (uVar2 == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vLeaves->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(0x40);
      }
      else {
        piVar4 = (int *)realloc(vLeaves->pArray,0x40);
      }
      vLeaves->pArray = piVar4;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar3 * 2;
      if (iVar6 <= (int)uVar3) goto LAB_003905e9;
      if (vLeaves->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((ulong)uVar3 << 3);
      }
      else {
        piVar4 = (int *)realloc(vLeaves->pArray,(ulong)uVar3 << 3);
      }
      vLeaves->pArray = piVar4;
    }
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vLeaves->nCap = iVar6;
  }
LAB_003905e9:
  iVar6 = vLeaves->nSize;
  vLeaves->nSize = iVar6 + 1;
  vLeaves->pArray[iVar6] = iVar1;
  return;
}

Assistant:

void If_CutFoundFanins_rec( If_Obj_t * pObj, Vec_Int_t * vLeaves )
{
    if ( pObj->nRefs || If_ObjIsCi(pObj) )
    {
        Vec_IntPushUnique( vLeaves, pObj->Id );
        return;
    }
    If_CutFoundFanins_rec( If_ObjFanin0(pObj), vLeaves );
    If_CutFoundFanins_rec( If_ObjFanin1(pObj), vLeaves );
}